

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block.cpp
# Opt level: O0

bool __thiscall
spvtools::val::BasicBlock::structurally_postdominates(BasicBlock *this,BasicBlock *other)

{
  bool bVar1;
  byte local_e2;
  BasicBlock *local_e0;
  byte local_d1;
  DominatorIterator local_d0;
  byte local_a1;
  DominatorIterator local_a0;
  DominatorIterator local_78;
  byte local_49;
  DominatorIterator local_48;
  BasicBlock *local_20;
  BasicBlock *other_local;
  BasicBlock *this_local;
  
  local_49 = 0;
  local_a1 = 0;
  local_d1 = 0;
  local_e2 = 1;
  local_20 = other;
  other_local = this;
  if (this != other) {
    structural_pdom_end(&local_48,other);
    local_49 = 1;
    structural_pdom_begin(&local_a0,local_20);
    local_a1 = 1;
    structural_pdom_end(&local_d0,local_20);
    local_d1 = 1;
    local_e0 = this;
    std::find<spvtools::val::BasicBlock::DominatorIterator,spvtools::val::BasicBlock_const*>
              (&local_78,&local_a0,&local_d0,&local_e0);
    bVar1 = val::operator==(&local_48,&local_78);
    local_e2 = bVar1 ^ 0xff;
  }
  this_local._7_1_ = local_e2 & 1;
  if (this != other) {
    DominatorIterator::~DominatorIterator(&local_78);
  }
  if ((local_d1 & 1) != 0) {
    DominatorIterator::~DominatorIterator(&local_d0);
  }
  if ((local_a1 & 1) != 0) {
    DominatorIterator::~DominatorIterator(&local_a0);
  }
  if ((local_49 & 1) != 0) {
    DominatorIterator::~DominatorIterator(&local_48);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool BasicBlock::structurally_postdominates(const BasicBlock& other) const {
  return (this == &other) || !(other.structural_pdom_end() ==
                               std::find(other.structural_pdom_begin(),
                                         other.structural_pdom_end(), this));
}